

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_aux.cpp
# Opt level: O2

void skiwi::error_label(asmcode *code,string *label_name,runtime_error re)

{
  operand oVar1;
  operand local_4c;
  operand local_48;
  operand local_44;
  ulong local_40;
  runtime_error local_34;
  
  local_40._0_4_ = LABEL;
  local_34 = re;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string_const&>
            (code,(operation *)&local_40,label_name);
  local_40 = CONCAT44(local_40._4_4_,0x55);
  local_48 = RAX;
  oVar1 = NUMBER;
  local_44 = DH;
  local_4c = oVar1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_40,&local_48,&local_4c,(int *)&local_44);
  local_48 = XMM6;
  local_4c = RAX;
  local_40 = (ulong)local_34;
  local_44 = oVar1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_48,&local_4c,&local_44,&local_40);
  local_40._0_4_ = SHL;
  local_48 = RAX;
  local_44 = DH;
  local_4c = oVar1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_40,&local_48,&local_4c,(int *)&local_44);
  local_40._0_4_ = OR;
  local_48 = RAX;
  local_44 = BYTE_MEM_RSP;
  local_4c = oVar1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_40,&local_48,&local_4c,(int *)&local_44);
  local_40 = CONCAT44(local_40._4_4_,0x2c);
  local_48 = MEM_R10;
  local_4c = 0x100;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand,int>
            (code,(operation *)&local_40,&local_48,(int *)&local_4c);
  return;
}

Assistant:

void error_label(asmcode& code, const std::string& label_name, runtime_error re)
  {
  code.add(asmcode::LABEL, label_name);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 8);
  code.add(asmcode::OR, asmcode::RAX, asmcode::NUMBER, (uint64_t)re);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 8);
  code.add(asmcode::OR, asmcode::RAX, asmcode::NUMBER, error_tag);
  code.add(asmcode::JMP, ERROR);
  }